

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

map_node_t ** map_getref(map_base_t *m,char *key)

{
  uint hash_00;
  int iVar1;
  map_node_t **local_30;
  map_node_t **next;
  uint hash;
  char *key_local;
  map_base_t *m_local;
  
  hash_00 = map_hash(key);
  if (m->nbuckets != 0) {
    local_30 = m->buckets;
    iVar1 = map_bucketidx(m,hash_00);
    for (local_30 = local_30 + iVar1; *local_30 != (map_node_t *)0x0; local_30 = &(*local_30)->next)
    {
      if (((*local_30)->hash == hash_00) &&
         (iVar1 = strcmp((char *)(*local_30 + 1),key), iVar1 == 0)) {
        return local_30;
      }
    }
  }
  return (map_node_t **)0x0;
}

Assistant:

static map_node_t **map_getref(map_base_t *m, const char *key) {
  unsigned hash = map_hash(key);
  map_node_t **next;
  if (m->nbuckets > 0) {
    next = &m->buckets[map_bucketidx(m, hash)];
    while (*next) {
      if ((*next)->hash == hash && !strcmp((char*) (*next + 1), key)) {
        return next;
      }
      next = &(*next)->next;
    }
  }
  return NULL;
}